

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_is_when_false(lyd_node *root,lyd_node *last_parent,lys_node *schema,int options)

{
  int iVar1;
  lyd_node *node;
  lys_node *local_50;
  lyd_node *dummy;
  lyd_node *current;
  int_log_opts prev_ilo;
  int options_local;
  lys_node *schema_local;
  lyd_node *last_parent_local;
  lyd_node *root_local;
  
  if (((options & 0x10000ffU) == 0) || ((options & 0x1000071U) != 0)) {
    if (last_parent == (lyd_node *)0x0) {
      local_50 = (lys_node *)0x0;
    }
    else {
      local_50 = last_parent->schema;
    }
    current._4_4_ = options;
    _prev_ilo = schema;
    schema_local = (lys_node *)last_parent;
    last_parent_local = root;
    iVar1 = resolve_applies_when(schema,1,local_50);
    if (iVar1 != 0) {
      if (_prev_ilo->nodetype == LYS_CHOICE) {
        _prev_ilo = lys_getnext((lys_node *)0x0,_prev_ilo,(lys_module *)0x0,0x100);
      }
      node = lyd_new_dummy(last_parent_local,(lyd_node *)schema_local,_prev_ilo,(char *)0x0,0);
      if (node == (lyd_node *)0x0) {
        return -1;
      }
      dummy = node;
      if ((node->parent == (lyd_node *)0x0) && (last_parent_local != (lyd_node *)0x0)) {
        lyd_insert_before(last_parent_local,node);
      }
      for (; dummy != (lyd_node *)0x0; dummy = dummy->child) {
        ly_ilo_change((ly_ctx *)0x0,ILO_IGNORE,(int_log_opts *)&current,(ly_err_item **)0x0);
        resolve_when(dummy,0,(lys_when **)0x0);
        ly_ilo_restore((ly_ctx *)0x0,(int_log_opts)current,(ly_err_item *)0x0,0);
        if (((byte)dummy->field_0x9 >> 1 & 1) != 0) {
          lyd_free(node);
          return 1;
        }
        if ((dummy->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) break;
      }
      lyd_free(node);
    }
  }
  return 0;
}

Assistant:

static int
lyd_is_when_false(struct lyd_node *root, struct lyd_node *last_parent, struct lys_node *schema, int options)
{
    enum int_log_opts prev_ilo;
    struct lyd_node *current, *dummy;

    if ((!(options & LYD_OPT_TYPEMASK) || (options & (LYD_OPT_CONFIG | LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF | LYD_OPT_DATA_TEMPLATE)))
            && resolve_applies_when(schema, 1, last_parent ? last_parent->schema : NULL)) {
        /* evaluate when statements on a dummy data node */
        if (schema->nodetype == LYS_CHOICE) {
            schema = (struct lys_node *)lys_getnext(NULL, schema, NULL, LYS_GETNEXT_NOSTATECHECK);
        }
        dummy = lyd_new_dummy(root, last_parent, schema, NULL, 0);
        if (!dummy) {
            return -1;
        }
        if (!dummy->parent && root) {
            /* connect dummy nodes into the data tree, insert it before the root
             * to optimize later unlinking (lyd_free()) */
            lyd_insert_before(root, dummy);
        }
        for (current = dummy; current; current = current->child) {
            ly_ilo_change(NULL, ILO_IGNORE, &prev_ilo, NULL);
            resolve_when(current, 0, NULL);
            ly_ilo_restore(NULL, prev_ilo, NULL, 0);

            if (current->when_status & LYD_WHEN_FALSE) {
                /* when evaluates to false */
                lyd_free(dummy);
                return 1;
            }

            if (current->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                /* termination node without a child */
                break;
            }
        }
        lyd_free(dummy);
    }

    return 0;
}